

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qpagesetupdialog_unix_p.cpp
# Opt level: O0

void QPageSetupWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QPageSetupWidget *this;
  uint in_EDX;
  int in_ESI;
  QPageSetupWidget *in_RDI;
  QPageSetupWidget *_t;
  
  if (in_ESI == 0) {
    this = (QPageSetupWidget *)(ulong)in_EDX;
    switch(this) {
    case (QPageSetupWidget *)0x0:
      pageSizeChanged(_t);
      break;
    case (QPageSetupWidget *)0x1:
      pageOrientationChanged(in_RDI);
      break;
    case (QPageSetupWidget *)0x2:
      pagesPerSheetChanged((QPageSetupWidget *)in_RDI);
      break;
    case (QPageSetupWidget *)0x3:
      unitChanged(this);
      break;
    case (QPageSetupWidget *)0x4:
      topMarginChanged(in_RDI,(double)this);
      break;
    case (QPageSetupWidget *)0x5:
      bottomMarginChanged(in_RDI,(double)this);
      break;
    case (QPageSetupWidget *)0x6:
      leftMarginChanged(in_RDI,(double)this);
      break;
    case (QPageSetupWidget *)0x7:
      rightMarginChanged(in_RDI,(double)this);
    }
  }
  return;
}

Assistant:

void QPageSetupWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPageSetupWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->pageSizeChanged(); break;
        case 1: _t->pageOrientationChanged(); break;
        case 2: _t->pagesPerSheetChanged(); break;
        case 3: _t->unitChanged(); break;
        case 4: _t->topMarginChanged((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 5: _t->bottomMarginChanged((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 6: _t->leftMarginChanged((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 7: _t->rightMarginChanged((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        default: ;
        }
    }
}